

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringRef * __thiscall
Catch::Capturer::Capturer::anon_class_8_1_a855c668::operator()
          (anon_class_8_1_a855c668 *this,size_t start,size_t end)

{
  char cVar1;
  int iVar2;
  size_type in_RCX;
  size_type in_RDX;
  StringRef *in_RSI;
  StringRef *in_RDI;
  bool bVar3;
  StringRef *start_00;
  size_type local_20;
  size_type local_18;
  
  start_00 = in_RDI;
  local_18 = in_RDX;
  while( true ) {
    cVar1 = StringRef::operator[]((StringRef *)in_RSI->m_start,local_18);
    bVar3 = true;
    if (cVar1 != ',') {
      cVar1 = StringRef::operator[]((StringRef *)in_RSI->m_start,local_18);
      iVar2 = isspace((int)cVar1);
      bVar3 = iVar2 != 0;
    }
    local_20 = in_RCX;
    if (!bVar3) break;
    local_18 = local_18 + 1;
  }
  while( true ) {
    cVar1 = StringRef::operator[]((StringRef *)in_RSI->m_start,local_20);
    bVar3 = true;
    if (cVar1 != ',') {
      cVar1 = StringRef::operator[]((StringRef *)in_RSI->m_start,local_20);
      iVar2 = isspace((int)cVar1);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    local_20 = local_20 - 1;
  }
  StringRef::substr(in_RSI,(size_type)start_00,(size_type)in_RDI);
  return start_00;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(names[start])) {
                ++start;
            }
            while (names[end] == ',' || isspace(names[end])) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case ',':
                if (start != pos && openings.size() == 0) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = trimmed(start, pos);
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.size() == 0 && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = trimmed(start, names.size() - 1);
        m_messages.back().message += " := ";
    }